

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void clear_ech(st_ptls_ech_t *ech,int is_server)

{
  st_ptls_aead_context_t *__ptr;
  char *__ptr_00;
  
  __ptr = ech->aead;
  if (__ptr != (st_ptls_aead_context_t *)0x0) {
    (*__ptr->dispose_crypto)(__ptr);
    free(__ptr);
    ech->aead = (ptls_aead_context_t *)0x0;
  }
  (*ptls_clear_memory)(ech->inner_client_random,0x20);
  if (is_server == 0) {
    free((ech->client).enc.base);
    (ech->client).enc.base = (uint8_t *)0x0;
    (ech->client).enc.len = 0;
    __ptr_00 = (ech->client).public_name;
    if (__ptr_00 != (char *)0x0) {
      free(__ptr_00);
      (ech->client).public_name = (char *)0x0;
    }
    free((ech->client).first_ech.base);
    (ech->client).first_ech.base = (uint8_t *)0x0;
    (ech->client).first_ech.len = 0;
  }
  return;
}

Assistant:

static void clear_ech(struct st_ptls_ech_t *ech, int is_server)
{
    if (ech->aead != NULL) {
        ptls_aead_free(ech->aead);
        ech->aead = NULL;
    }
    ptls_clear_memory(ech->inner_client_random, PTLS_HELLO_RANDOM_SIZE);
    if (!is_server) {
        free(ech->client.enc.base);
        ech->client.enc = ptls_iovec_init(NULL, 0);
        if (ech->client.public_name != NULL) {
            free(ech->client.public_name);
            ech->client.public_name = NULL;
        }
        free(ech->client.first_ech.base);
        ech->client.first_ech = ptls_iovec_init(NULL, 0);
    }
}